

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  ulong extraout_XMM0_Qb;
  ulong uVar11;
  undefined1 auVar12 [56];
  undefined1 auVar10 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vector3f VVar18;
  SampledSpectrum SVar19;
  optional<pbrt::Bounds2<float>_> b;
  Tuple3<pbrt::Point3,_float> local_88;
  Tuple2<pbrt::Point2,_float> local_78;
  float local_6c;
  undefined8 local_68;
  ulong uStack_60;
  Tuple2<pbrt::Point2,_float> local_58;
  ulong uStack_50;
  undefined1 local_48 [16];
  optional<pbrt::Bounds2<float>_> local_2c;
  undefined1 auVar14 [56];
  
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_78 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9._0_16_);
  auVar4 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar8._0_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                 high + auVar4._0_4_;
  auVar8._4_4_ = ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                 low + auVar4._4_4_;
  auVar8._8_4_ = auVar4._8_4_ + 0.0;
  auVar8._12_4_ = auVar4._12_4_ + 0.0;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  local_48 = vmulps_avx512vl(auVar8,auVar4);
  fVar5 = (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
          ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
          0.5;
  local_88._0_8_ = vmovlps_avx(local_48);
  local_88.z = fVar5;
  ImageBounds(&local_2c,this,(Point3f *)&local_88);
  if (local_2c.set != false) {
    local_58 = (Tuple2<pbrt::Point2,_float>)
               WindowedPiecewiseConstant2D::Sample
                         (&this->distribution,(Point2f *)&local_78,(Bounds2f *)&local_2c,&local_88.x
                         );
    auVar14 = (undefined1  [56])0x0;
    if ((local_88.x != 0.0) || (NAN(local_88.x))) {
      uVar11 = extraout_XMM0_Qb;
      uStack_50 = extraout_XMM0_Qb;
      VVar18 = RenderFromImage(this,(Point2f)local_58,&local_6c);
      local_68 = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      if ((local_6c != 0.0) || (NAN(local_6c))) {
        fVar7 = local_88.x / local_6c;
        if (ABS(fVar7) != INFINITY) {
          auVar12 = ZEXT856(uStack_50);
          uStack_60 = uVar11;
          SVar19 = ImageLookup(this,(Point2f)local_58,&lambda);
          auVar13._0_8_ = SVar19.values.values._8_8_;
          auVar13._8_56_ = auVar14;
          auVar10._0_8_ = SVar19.values.values._0_8_;
          auVar10._8_56_ = auVar12;
          fVar1 = this->sceneRadius;
          auVar6._8_8_ = uStack_60;
          auVar6._0_8_ = local_68;
          auVar4 = vmovlhps_avx(auVar10._0_16_,auVar13._0_16_);
          *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
          fVar1 = fVar1 + fVar1;
          auVar8 = vmovshdup_avx(auVar6);
          fVar5 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z * fVar1 + fVar5;
          fVar3 = local_48._0_4_ + (float)local_68 * fVar1;
          auVar15 = vmovshdup_avx(local_48);
          fVar1 = auVar15._0_4_ + auVar8._0_4_ * fVar1;
          auVar16._4_4_ = fVar3;
          auVar16._0_4_ = fVar3;
          auVar16._8_4_ = fVar3;
          auVar16._12_4_ = fVar3;
          auVar17._4_4_ = fVar1;
          auVar17._0_4_ = fVar1;
          auVar17._8_4_ = fVar1;
          auVar17._12_4_ = fVar1;
          auVar8 = vmovlhps_avx(auVar16,auVar17);
          auVar15._4_4_ = fVar5;
          auVar15._0_4_ = fVar5;
          auVar15._8_4_ = fVar5;
          auVar15._12_4_ = fVar5;
          *(undefined1 (*) [32])((long)&__return_storage_ptr__->optionalValue + 0x38) =
               ZEXT432(0) << 0x20;
          __return_storage_ptr__->set = true;
          *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar4;
          uVar2 = vmovlps_avx(auVar6);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
               VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = fVar7;
          *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar8;
          uVar2 = vmovlps_avx(auVar15);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar2;
          *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
               &(this->super_LightBase).mediumInterface;
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
          return __return_storage_ptr__;
        }
        LogFatal<char_const(&)[12]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
                   ,0x482,"Check failed: %s",(char (*) [12])"!IsInf(pdf)");
      }
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> PortalImageInfiniteLight::SampleLi(
    LightSampleContext ctx, Point2f u, SampledWavelengths lambda,
    LightSamplingMode mode) const {
    // Sample $(u,v)$ in potentially-visible region of light image
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return {};
    Float mapPDF;
    Point2f uv = distribution.Sample(u, *b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert portal image sample point to direction and compute PDF
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    // Compute radiance for portal light sample and return _LightLiSample_
    SampledSpectrum L = ImageLookup(uv, lambda);
    Point3f pl = ctx.p() + 2 * sceneRadius * wi;
    return LightLiSample(L, wi, pdf, Interaction(pl, &mediumInterface));
}